

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::addBlock(BaseRAPass *this,RABlock *block)

{
  ZoneVector<asmjit::v1_14::RABlock_*> *in_RSI;
  ZoneVector<asmjit::v1_14::RABlock_*> *in_RDI;
  Error _err;
  RABlock **in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Error local_1c;
  
  local_1c = ZoneVector<asmjit::v1_14::RABlock_*>::willGrow
                       (in_RSI,(ZoneAllocator *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        (uint32_t)((ulong)in_RDI >> 0x20));
  if (local_1c == 0) {
    *(undefined4 *)(in_RSI + 8) = *(undefined4 *)(in_RDI + 0xb8);
    ZoneVector<asmjit::v1_14::RABlock_*>::appendUnsafe(in_RDI,in_stack_ffffffffffffffb8);
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

Error BaseRAPass::addBlock(RABlock* block) noexcept {
  ASMJIT_PROPAGATE(_blocks.willGrow(allocator()));

  block->_blockId = blockCount();
  _blocks.appendUnsafe(block);
  return kErrorOk;
}